

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_lcp_2way_unstable<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  lcp_t *lcp_result;
  MergeResult MVar4;
  ostream *poVar5;
  uchar **ppuVar6;
  ulong uVar7;
  size_t n_00;
  ulong uVar8;
  uchar **ppuVar9;
  lcp_t lVar10;
  byte bVar11;
  uchar uVar12;
  byte bVar13;
  long lVar14;
  lcp_t *plVar15;
  char local_69;
  lcp_t *local_68;
  uchar **local_60;
  uchar **local_58;
  lcp_t *local_50;
  uchar **local_48;
  lcp_t *local_40;
  MergeResult local_38;
  MergeResult local_34;
  
  local_68 = lcp_output;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"mergesort_lcp_2way_unstable",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n=",6);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_69 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_69,1);
  if (n < 0x20) {
    if (1 < n) {
      uVar8 = n & 0xffffffff;
      ppuVar6 = strings_input;
      do {
        pbVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar9 = ppuVar6; strings_input < ppuVar9; ppuVar9 = ppuVar9 + -1) {
          pbVar2 = ppuVar9[-1];
          bVar11 = *pbVar2;
          bVar13 = *pbVar1;
          if (bVar11 != 0 && bVar11 == bVar13) {
            lVar14 = 1;
            do {
              bVar11 = pbVar2[lVar14];
              bVar13 = pbVar1[lVar14];
              if (bVar11 == 0) break;
              lVar14 = lVar14 + 1;
            } while (bVar11 == bVar13);
          }
          if (bVar11 <= bVar13) break;
          *ppuVar9 = pbVar2;
        }
        iVar3 = (int)uVar8;
        uVar8 = (ulong)(iVar3 - 1);
        *ppuVar9 = pbVar1;
      } while (2 < iVar3);
    }
    if (n != 1) {
      uVar8 = 0;
      do {
        uVar7 = uVar8 + 1 & 0xffffffff;
        uVar12 = *strings_input[uVar8];
        if (uVar12 == '\0') {
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          do {
            if (uVar12 != strings_input[uVar7][lVar10]) break;
            uVar12 = strings_input[uVar8][lVar10 + 1];
            lVar10 = lVar10 + 1;
          } while (uVar12 != '\0');
        }
        lcp_input[uVar8] = lVar10;
        uVar8 = uVar8 + 1;
      } while (uVar7 < n - 1);
    }
LAB_0024e237:
    MVar4 = SortedInPlace;
  }
  else {
    uVar8 = n >> 1;
    local_60 = strings_output;
    MVar4 = mergesort_lcp_2way_unstable<true>(strings_input,strings_output,lcp_input,local_68,uVar8)
    ;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"mergesort_lcp_2way_unstable",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): checking first merge\n",0x19);
    ppuVar6 = local_60;
    plVar15 = local_68;
    local_34 = MVar4;
    if (MVar4 == SortedInPlace) {
      check_input(strings_input,lcp_input,uVar8);
      plVar15 = local_68;
      ppuVar6 = local_60;
    }
    else {
      check_input(local_60,local_68,uVar8);
    }
    local_58 = strings_input + uVar8;
    local_48 = ppuVar6 + uVar8;
    local_40 = lcp_input + uVar8;
    local_50 = plVar15 + uVar8;
    n_00 = n - uVar8;
    MVar4 = mergesort_lcp_2way_unstable<true>(local_58,local_48,local_40,local_50,n_00);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"mergesort_lcp_2way_unstable",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): checking second merge\n",0x1a);
    plVar15 = local_40;
    local_38 = MVar4;
    if (MVar4 == SortedInPlace) {
      check_input(local_58,local_40,n_00);
    }
    else {
      check_input(local_48,local_50,n_00);
      plVar15 = local_40;
    }
    lcp_result = local_68;
    if (local_34 == local_38) {
      if (local_34 != SortedInPlace) {
        merge_lcp_2way_unstable<true>
                  (local_60,local_68,uVar8,local_48,local_50,n_00,strings_input,lcp_input);
        goto LAB_0024e237;
      }
    }
    else {
      if (local_34 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x6b7,
                      "MergeResult mergesort_lcp_2way_unstable(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      memcpy(local_58,local_48,n_00 * 8);
      plVar15 = local_40;
      memcpy(local_40,local_50,n_00 * 8);
    }
    merge_lcp_2way_unstable<true>
              (strings_input,lcp_input,uVar8,local_58,plVar15,n_00,local_60,lcp_result);
    MVar4 = SortedInTemp;
  }
  return MVar4;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml = mergesort_lcp_2way_unstable<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);

	debug() << __func__ << "(): checking first merge\n";
	if (ml == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);

	MergeResult mr = mergesort_lcp_2way_unstable<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);

	debug() << __func__ << "(): checking second merge\n";
	if (mr == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  n-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, n-split0);

	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}